

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_ref_t art_node_erase(art_t *art,art_inner_node_t *node,art_typecode_t typecode,
                        art_key_chunk_t key_chunk)

{
  undefined1 in_DL;
  undefined8 in_RSI;
  art_node256_t *in_RDI;
  art_node16_t *unaff_retaddr;
  undefined6 in_stack_00000008;
  uint8_t key_chunk_00;
  art_t *in_stack_fffffffffffffff8;
  art_ref_t aVar1;
  
  key_chunk_00 = (uint8_t)((ulong)in_RSI >> 0x38);
  switch(in_DL) {
  case 2:
    aVar1 = art_node4_erase(art,(art_node4_t *)node,typecode);
    break;
  case 3:
    aVar1 = art_node16_erase((art_t *)CONCAT17(typecode,CONCAT16(key_chunk,in_stack_00000008)),
                             unaff_retaddr,(uint8_t)((ulong)in_stack_fffffffffffffff8 >> 0x38));
    break;
  case 4:
    aVar1 = art_node48_erase(in_stack_fffffffffffffff8,(art_node48_t *)in_RDI,key_chunk_00);
    break;
  case 5:
    aVar1 = art_node256_erase(in_stack_fffffffffffffff8,in_RDI,key_chunk_00);
    break;
  default:
    aVar1 = 0;
  }
  return aVar1;
}

Assistant:

static art_ref_t art_node_erase(art_t *art, art_inner_node_t *node,
                                art_typecode_t typecode,
                                art_key_chunk_t key_chunk) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            return art_node4_erase(art, (art_node4_t *)node, key_chunk);
        case CROARING_ART_NODE16_TYPE:
            return art_node16_erase(art, (art_node16_t *)node, key_chunk);
        case CROARING_ART_NODE48_TYPE:
            return art_node48_erase(art, (art_node48_t *)node, key_chunk);
        case CROARING_ART_NODE256_TYPE:
            return art_node256_erase(art, (art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return CROARING_ART_NULL_REF;
    }
}